

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O2

Formula * __thiscall Kernel::FormulaTransformer::applyBinary(FormulaTransformer *this,Formula *f)

{
  Formula *pFVar1;
  Formula *pFVar2;
  Formula *this_00;
  
  pFVar1 = apply(this,*(Formula **)(f + 1));
  pFVar2 = apply(this,(Formula *)f[1]._label._M_dataplus._M_p);
  if ((pFVar1 != *(Formula **)(f + 1)) || (pFVar2 != (Formula *)f[1]._label._M_dataplus._M_p)) {
    this_00 = (Formula *)BinaryFormula::operator_new(0x38);
    Formula::Formula(this_00,f->_connective);
    *(Formula **)(this_00 + 1) = pFVar1;
    this_00[1]._label._M_dataplus._M_p = (pointer)pFVar2;
    f = this_00;
  }
  return f;
}

Assistant:

Formula* FormulaTransformer::applyBinary(Formula* f)
{
  Formula* newLeft = apply(f->left());
  Formula* newRight = apply(f->right());
  if(newLeft==f->left() && newRight==f->right()) {
    return f;
  }
  return new BinaryFormula(f->connective(), newLeft, newRight);
}